

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.hpp
# Opt level: O2

void __thiscall
duckdb::TemplatedValidityMask<unsigned_char>::SetAllValid
          (TemplatedValidityMask<unsigned_char> *this,idx_t count)

{
  long lVar1;
  idx_t i;
  long lVar2;
  
  EnsureWritable(this);
  if (count != 0) {
    lVar1 = (count + 7 >> 3) - 1;
    for (lVar2 = 0; lVar1 != lVar2; lVar2 = lVar2 + 1) {
      this->validity_mask[lVar2] = 0xff;
    }
    this->validity_mask[lVar1] =
         this->validity_mask[lVar1] | -((count & 7) == 0) | ~(-1 << ((byte)count & 7));
  }
  return;
}

Assistant:

inline void SetAllValid(idx_t count) {
		EnsureWritable();
		if (count == 0) {
			return;
		}
		auto last_entry_index = ValidityBuffer::EntryCount(count) - 1;
		for (idx_t i = 0; i < last_entry_index; i++) {
			validity_mask[i] = ValidityBuffer::MAX_ENTRY;
		}
		auto last_entry_bits = count % BITS_PER_VALUE;
		validity_mask[last_entry_index] |= (last_entry_bits == 0)
		                                       ? ValidityBuffer::MAX_ENTRY
		                                       : ~static_cast<V>(ValidityBuffer::MAX_ENTRY << (last_entry_bits));
	}